

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

void xmlBufferEmpty(xmlBufferPtr buf)

{
  size_t start_buf;
  xmlBufferPtr buf_local;
  
  if ((buf != (xmlBufferPtr)0x0) && (buf->content != (xmlChar *)0x0)) {
    buf->use = 0;
    if (buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE) {
      buf->content = "";
    }
    else if ((buf->alloc == XML_BUFFER_ALLOC_IO) && (buf->contentIO != (xmlChar *)0x0)) {
      buf->size = buf->size + ((int)buf->content - (int)buf->contentIO);
      buf->content = buf->contentIO;
      *buf->content = '\0';
    }
    else {
      *buf->content = '\0';
    }
  }
  return;
}

Assistant:

void
xmlBufferEmpty(xmlBufferPtr buf) {
    if (buf == NULL) return;
    if (buf->content == NULL) return;
    buf->use = 0;
    if (buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE) {
        buf->content = BAD_CAST "";
    } else if ((buf->alloc == XML_BUFFER_ALLOC_IO) &&
               (buf->contentIO != NULL)) {
        size_t start_buf = buf->content - buf->contentIO;

	buf->size += start_buf;
        buf->content = buf->contentIO;
        buf->content[0] = 0;
    } else {
        buf->content[0] = 0;
    }
}